

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O2

void __thiscall ZXing::Pdf417::Writer::Writer(Writer *this)

{
  pointer __p;
  
  this->_margin = -1;
  this->_ecLevel = -1;
  (this->_encoder)._M_t.
  super___uniq_ptr_impl<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_>._M_t.
  super__Tuple_impl<0UL,_ZXing::Pdf417::Encoder_*,_std::default_delete<ZXing::Pdf417::Encoder>_>.
  super__Head_base<0UL,_ZXing::Pdf417::Encoder_*,_false>._M_head_impl = (Encoder *)0x0;
  __p = (pointer)operator_new(0x1c);
  __p->_compact = false;
  __p->_compaction = AUTO;
  __p->_encoding = ISO8859_1;
  __p->_minCols = 2;
  __p->_maxCols = 0x1e;
  __p->_minRows = 2;
  __p->_maxRows = 0x1e;
  std::__uniq_ptr_impl<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_>::reset
            ((__uniq_ptr_impl<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_>
              *)&this->_encoder,__p);
  return;
}

Assistant:

Writer::Writer()
{
	_encoder.reset(new Encoder);
}